

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O2

void __thiscall
defyx::JitCompilerX86::generateSuperscalarHash<2ul>
          (JitCompilerX86 *this,SuperscalarProgram (*programs) [2],
          vector<unsigned_long,_std::allocator<unsigned_long>_> *reciprocalCache)

{
  uint8_t *puVar1;
  int iVar2;
  long lVar3;
  uint i;
  uint uVar4;
  uint j;
  long lVar5;
  
  iVar2 = codeSshInitSize;
  memcpy(this->code + 0x2000,codeShhInit,(long)codeSshInitSize);
  iVar2 = iVar2 + 0x2000;
  this->codePos = iVar2;
  for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
    for (uVar4 = 0; iVar2 = codeSshLoadSize, uVar4 < (*programs)[lVar5].size; uVar4 = uVar4 + 1) {
      generateSuperscalarCode(this,(*programs)[lVar5].programBuffer + (int)uVar4,reciprocalCache);
    }
    memcpy(this->code + this->codePos,codeShhLoad,(long)codeSshLoadSize);
    iVar2 = this->codePos + iVar2;
    this->codePos = iVar2;
    if (lVar5 == 0) {
      puVar1 = this->code;
      (puVar1 + iVar2)[0] = 'I';
      (puVar1 + iVar2)[1] = 0x8b;
      iVar2 = this->codePos + 2;
      this->codePos = iVar2;
      this->code[iVar2] = (char)(*programs)[0].addrReg + 0xd8;
      lVar3 = (long)this->codePos + 1;
      this->codePos = (int32_t)lVar3;
      iVar2 = codeSshPrefetchSize;
      memcpy(this->code + lVar3,codeShhPrefetch,(long)codeSshPrefetchSize);
      iVar2 = this->codePos + iVar2;
      this->codePos = iVar2;
    }
  }
  this->code[iVar2] = 0xc3;
  this->codePos = this->codePos + 1;
  return;
}

Assistant:

void JitCompilerX86::generateSuperscalarHash(SuperscalarProgram(&programs)[N], std::vector<uint64_t> &reciprocalCache) {
		memcpy(code + superScalarHashOffset, codeShhInit, codeSshInitSize);
		codePos = superScalarHashOffset + codeSshInitSize;
		for (unsigned j = 0; j < N; ++j) {
			SuperscalarProgram& prog = programs[j];
			for (unsigned i = 0; i < prog.getSize(); ++i) {
				Instruction& instr = prog(i);
				generateSuperscalarCode(instr, reciprocalCache);
			}
			emit(codeShhLoad, codeSshLoadSize);
			if (j < N - 1) {
				emit(REX_MOV_RR64);
				emitByte(0xd8 + prog.getAddressRegister());
				emit(codeShhPrefetch, codeSshPrefetchSize);
#ifdef RANDOMX_ALIGN
				int align = (codePos % 16);
				while (align != 0) {
					int nopSize = 16 - align;
					if (nopSize > 8) nopSize = 8;
					emit(NOPX[nopSize - 1], nopSize);
					align = (codePos % 16);
				}
#endif
			}
		}
		emitByte(RET);
	}